

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

internals * pybind11::detail::get_internals(void)

{
  bool bVar1;
  int iVar2;
  internals ***pppiVar3;
  internals **ppiVar4;
  internals *this;
  unsigned_long uVar5;
  PyTypeObject *pPVar6;
  PyObject *pPVar7;
  _func_void_exception_ptr *local_b0;
  item_accessor local_a8;
  capsule local_88;
  long local_80;
  PyThreadState *tstate;
  internals **internals_ptr;
  PyObject *local_68;
  handle local_60;
  object internals_obj;
  handle local_50;
  dict state_dict;
  undefined1 local_38 [8];
  error_scope err_scope;
  gil_scoped_acquire_local gil;
  internals ***internals_pp;
  
  pppiVar3 = get_internals_pp();
  if ((*pppiVar3 == (internals **)0x0) || (**pppiVar3 == (internals *)0x0)) {
    get_internals::gil_scoped_acquire_local::gil_scoped_acquire_local
              ((gil_scoped_acquire_local *)((long)&err_scope.trace + 4));
    error_scope::error_scope((error_scope *)local_38);
    get_python_state_dict();
    dict::dict((dict *)&local_50,&internals_obj);
    object::~object(&internals_obj);
    local_68 = local_50.m_ptr;
    get_internals_obj_from_state_dict((detail *)&local_60,local_50);
    bVar1 = handle::operator_cast_to_bool(&local_60);
    if (bVar1) {
      internals_ptr = (internals **)local_60.m_ptr;
      ppiVar4 = get_internals_pp_from_capsule(local_60);
      *pppiVar3 = ppiVar4;
    }
    object::~object((object *)&local_60);
    if ((*pppiVar3 == (internals **)0x0) || (**pppiVar3 == (internals *)0x0)) {
      if (*pppiVar3 == (internals **)0x0) {
        ppiVar4 = (internals **)operator_new(8);
        *ppiVar4 = (internals *)0x0;
        *pppiVar3 = ppiVar4;
      }
      tstate = (PyThreadState *)*pppiVar3;
      this = (internals *)operator_new(0x1d8);
      memset(this,0,0x1d8);
      internals::internals(this);
      tstate->prev = (_ts *)this;
      local_80 = PyThreadState_Get();
      uVar5 = PyThread_tss_alloc();
      tstate->prev[1].thread_id = uVar5;
      if ((uVar5 == 0) || (iVar2 = PyThread_tss_create(tstate->prev[1].thread_id), iVar2 != 0)) {
        pybind11_fail("get_internals: could not successfully initialize the tstate TSS key!");
      }
      PyThread_tss_set(tstate->prev[1].thread_id,local_80);
      *(undefined8 *)&tstate->prev[1].trash_delete_nesting = *(undefined8 *)(local_80 + 0x10);
      capsule::capsule(&local_88,*pppiVar3,(char *)0x0,(PyCapsule_Destructor)0x0);
      object_api<pybind11::handle>::operator[]
                (&local_a8,(object_api<pybind11::handle> *)&local_50,
                 "__pybind11_internals_v4_clang_libstdcpp_cxxabi1002__");
      accessor<pybind11::detail::accessor_policies::generic_item>::operator=(&local_a8,&local_88);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_a8);
      capsule::~capsule(&local_88);
      local_b0 = translate_exception;
      std::
      forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
      ::push_front((forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
                    *)&tstate->prev[1].c_profilefunc,&local_b0);
      pPVar6 = make_static_property_type();
      tstate->prev[1].dict = (PyObject *)pPVar6;
      pPVar6 = make_default_metaclass();
      *(PyTypeObject **)&tstate->prev[1].gilstate_counter = pPVar6;
      pPVar7 = make_object_base_type(*(PyTypeObject **)&tstate->prev[1].gilstate_counter);
      tstate->prev[1].async_exc = pPVar7;
    }
    internals_pp = (internals ***)**pppiVar3;
    dict::~dict((dict *)&local_50);
    error_scope::~error_scope((error_scope *)local_38);
    get_internals::gil_scoped_acquire_local::~gil_scoped_acquire_local
              ((gil_scoped_acquire_local *)((long)&err_scope.trace + 4));
  }
  else {
    internals_pp = (internals ***)**pppiVar3;
  }
  return (internals *)internals_pp;
}

Assistant:

PYBIND11_NOINLINE internals &get_internals() {
    auto **&internals_pp = get_internals_pp();
    if (internals_pp && *internals_pp) {
        return **internals_pp;
    }

#if defined(PYBIND11_SIMPLE_GIL_MANAGEMENT)
    gil_scoped_acquire gil;
#else
    // Ensure that the GIL is held since we will need to make Python calls.
    // Cannot use py::gil_scoped_acquire here since that constructor calls get_internals.
    struct gil_scoped_acquire_local {
        gil_scoped_acquire_local() : state(PyGILState_Ensure()) {}
        gil_scoped_acquire_local(const gil_scoped_acquire_local &) = delete;
        gil_scoped_acquire_local &operator=(const gil_scoped_acquire_local &) = delete;
        ~gil_scoped_acquire_local() { PyGILState_Release(state); }
        const PyGILState_STATE state;
    } gil;
#endif
    error_scope err_scope;

    dict state_dict = get_python_state_dict();
    if (object internals_obj = get_internals_obj_from_state_dict(state_dict)) {
        internals_pp = get_internals_pp_from_capsule(internals_obj);
    }
    if (internals_pp && *internals_pp) {
        // We loaded the internals through `state_dict`, which means that our `error_already_set`
        // and `builtin_exception` may be different local classes than the ones set up in the
        // initial exception translator, below, so add another for our local exception classes.
        //
        // libstdc++ doesn't require this (types there are identified only by name)
        // libc++ with CPython doesn't require this (types are explicitly exported)
        // libc++ with PyPy still need it, awaiting further investigation
#if !defined(__GLIBCXX__)
        (*internals_pp)->registered_exception_translators.push_front(&translate_local_exception);
#endif
    } else {
        if (!internals_pp) {
            internals_pp = new internals *();
        }
        auto *&internals_ptr = *internals_pp;
        internals_ptr = new internals();

        PyThreadState *tstate = PyThreadState_Get();
        // NOLINTNEXTLINE(bugprone-assignment-in-if-condition)
        if (!PYBIND11_TLS_KEY_CREATE(internals_ptr->tstate)) {
            pybind11_fail("get_internals: could not successfully initialize the tstate TSS key!");
        }
        PYBIND11_TLS_REPLACE_VALUE(internals_ptr->tstate, tstate);

#if PYBIND11_INTERNALS_VERSION > 4
        // NOLINTNEXTLINE(bugprone-assignment-in-if-condition)
        if (!PYBIND11_TLS_KEY_CREATE(internals_ptr->loader_life_support_tls_key)) {
            pybind11_fail("get_internals: could not successfully initialize the "
                          "loader_life_support TSS key!");
        }
#endif
        internals_ptr->istate = tstate->interp;
        state_dict[PYBIND11_INTERNALS_ID] = capsule(internals_pp);
        internals_ptr->registered_exception_translators.push_front(&translate_exception);
        internals_ptr->static_property_type = make_static_property_type();
        internals_ptr->default_metaclass = make_default_metaclass();
        internals_ptr->instance_base = make_object_base_type(internals_ptr->default_metaclass);
#ifdef Py_GIL_DISABLED
        // Scale proportional to the number of cores. 2x is a heuristic to reduce contention.
        auto num_shards
            = static_cast<size_t>(round_up_to_next_pow2(2 * std::thread::hardware_concurrency()));
        if (num_shards == 0) {
            num_shards = 1;
        }
        internals_ptr->instance_shards.reset(new instance_map_shard[num_shards]);
        internals_ptr->instance_shards_mask = num_shards - 1;
#endif // Py_GIL_DISABLED
    }
    return **internals_pp;
}